

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnfFast.c
# Opt level: O1

Cnf_Dat_t * Cnf_DeriveFastClauses(Aig_Man_t *p,int nOutputs)

{
  void *pvVar1;
  Aig_Obj_t *pRoot;
  bool bVar2;
  uint uVar3;
  Vec_Int_t *p_00;
  int *piVar4;
  Vec_Int_t *p_01;
  Vec_Int_t *vMap;
  Vec_Ptr_t *pVVar5;
  void **ppvVar6;
  Vec_Ptr_t *vNodes;
  Vec_Int_t *vCover;
  Vec_Int_t *vClauses;
  Vec_Ptr_t *pVVar7;
  Cnf_Dat_t *pCVar8;
  int **ppiVar9;
  int iVar10;
  long lVar11;
  ulong uVar12;
  int Entry;
  Vec_Int_t *p_02;
  int iVar13;
  long lVar14;
  
  p_00 = (Vec_Int_t *)malloc(0x10);
  p_00->nCap = 0x10000;
  p_00->nSize = 0;
  piVar4 = (int *)malloc(0x40000);
  p_00->pArray = piVar4;
  p_01 = (Vec_Int_t *)malloc(0x10);
  p_01->nCap = 0x1000;
  p_01->nSize = 0;
  piVar4 = (int *)malloc(0x4000);
  p_01->pArray = piVar4;
  pVVar7 = p->vObjs;
  iVar13 = pVVar7->nSize;
  vMap = (Vec_Int_t *)malloc(0x10);
  iVar10 = 0x10;
  if (0xe < iVar13 - 1U) {
    iVar10 = iVar13;
  }
  vMap->nSize = 0;
  vMap->nCap = iVar10;
  if (iVar10 == 0) {
    piVar4 = (int *)0x0;
  }
  else {
    piVar4 = (int *)malloc((long)iVar10 << 2);
  }
  vMap->pArray = piVar4;
  vMap->nSize = iVar13;
  if (piVar4 != (int *)0x0) {
    memset(piVar4,0xff,(long)iVar13 << 2);
  }
  iVar13 = 1;
  if (nOutputs != 0) {
    iVar10 = p->nRegs;
    if (iVar10 == 0) {
      if (p->nObjs[3] != nOutputs) {
        __assert_fail("nOutputs == Aig_ManCoNum(p)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/cnf/cnfFast.c"
                      ,0x234,"Cnf_Dat_t *Cnf_DeriveFastClauses(Aig_Man_t *, int)");
      }
      pVVar5 = p->vCos;
      if (0 < pVVar5->nSize) {
        ppvVar6 = pVVar5->pArray;
        lVar11 = 0;
        do {
          iVar13 = *(int *)((long)ppvVar6[lVar11] + 0x24);
          if (((long)iVar13 < 0) || (vMap->nSize <= iVar13)) goto LAB_00559632;
          lVar11 = lVar11 + 1;
          piVar4[iVar13] = (int)lVar11;
        } while (lVar11 < pVVar5->nSize);
        iVar13 = (int)lVar11 + 1;
      }
    }
    else {
      if (iVar10 != nOutputs) {
        __assert_fail("nOutputs == Aig_ManRegNum(p)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/cnf/cnfFast.c"
                      ,0x23a,"Cnf_Dat_t *Cnf_DeriveFastClauses(Aig_Man_t *, int)");
      }
      uVar3 = p->nObjs[3] - iVar10;
      pVVar5 = p->vCos;
      if ((int)uVar3 < pVVar5->nSize) {
        uVar12 = (ulong)uVar3;
        iVar13 = 1;
        do {
          if ((int)uVar3 < 0) goto LAB_00559670;
          iVar10 = *(int *)((long)pVVar5->pArray[uVar12] + 0x24);
          if (((long)iVar10 < 0) || (vMap->nSize <= iVar10)) goto LAB_00559632;
          piVar4[iVar10] = iVar13;
          uVar12 = uVar12 + 1;
          iVar13 = iVar13 + 1;
        } while ((int)uVar12 < pVVar5->nSize);
      }
    }
  }
  lVar11 = (long)pVVar7->nSize;
  if (0 < (long)pVVar7->nSize) {
    do {
      if (pVVar7->nSize < lVar11) goto LAB_00559670;
      pvVar1 = pVVar7->pArray[lVar11 + -1];
      if (((pvVar1 != (void *)0x0) && ((*(ulong *)((long)pvVar1 + 0x18) & 0x10) != 0)) &&
         (0xfffffffd < ((uint)*(ulong *)((long)pvVar1 + 0x18) & 7) - 7)) {
        iVar10 = *(int *)((long)pvVar1 + 0x24);
        if (((long)iVar10 < 0) || (vMap->nSize <= iVar10)) goto LAB_00559632;
        piVar4[iVar10] = iVar13;
        iVar13 = iVar13 + 1;
      }
      bVar2 = 1 < lVar11;
      lVar11 = lVar11 + -1;
    } while (bVar2);
  }
  pVVar5 = p->vCis;
  if (0 < pVVar5->nSize) {
    ppvVar6 = pVVar5->pArray;
    lVar11 = 0;
    do {
      iVar10 = *(int *)((long)ppvVar6[lVar11] + 0x24);
      if (((long)iVar10 < 0) || (vMap->nSize <= iVar10)) goto LAB_00559632;
      piVar4[iVar10] = iVar13 + (int)lVar11;
      lVar11 = lVar11 + 1;
    } while (lVar11 < pVVar5->nSize);
    iVar13 = iVar13 + (int)lVar11;
  }
  iVar10 = p->pConst1->Id;
  if (((long)iVar10 < 0) || (vMap->nSize <= iVar10)) {
LAB_00559632:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                  ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
  }
  piVar4[iVar10] = iVar13;
  pVVar5 = (Vec_Ptr_t *)malloc(0x10);
  pVVar5->nCap = 100;
  pVVar5->nSize = 0;
  ppvVar6 = (void **)malloc(800);
  pVVar5->pArray = ppvVar6;
  vNodes = (Vec_Ptr_t *)malloc(0x10);
  vNodes->nCap = 100;
  vNodes->nSize = 0;
  ppvVar6 = (void **)malloc(800);
  vNodes->pArray = ppvVar6;
  vCover = (Vec_Int_t *)malloc(0x10);
  vCover->nCap = 0x10000;
  vCover->nSize = 0;
  piVar4 = (int *)malloc(0x40000);
  vCover->pArray = piVar4;
  vClauses = (Vec_Int_t *)malloc(0x10);
  vClauses->nCap = 100;
  vClauses->nSize = 0;
  piVar4 = (int *)malloc(400);
  vClauses->pArray = piVar4;
  lVar11 = (long)pVVar7->nSize;
  if (0 < (long)pVVar7->nSize) {
    do {
      if (p->vObjs->nSize < lVar11) {
LAB_00559670:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      pRoot = (Aig_Obj_t *)p->vObjs->pArray[lVar11 + -1];
      if (((pRoot != (Aig_Obj_t *)0x0) && ((*(ulong *)&pRoot->field_0x18 & 0x10) != 0)) &&
         (0xfffffffd < ((uint)*(ulong *)&pRoot->field_0x18 & 7) - 7)) {
        Cnf_ComputeClauses(p,pRoot,pVVar5,vNodes,vMap,vCover,vClauses);
        iVar10 = vClauses->nSize;
        if (0 < (long)iVar10) {
          piVar4 = vClauses->pArray;
          lVar14 = 0;
          do {
            Entry = piVar4[lVar14];
            p_02 = p_00;
            if (Entry == 0) {
              Entry = p_00->nSize;
              p_02 = p_01;
            }
            Vec_IntPush(p_02,Entry);
            lVar14 = lVar14 + 1;
          } while (iVar10 != lVar14);
        }
      }
      bVar2 = 1 < lVar11;
      lVar11 = lVar11 + -1;
    } while (bVar2);
  }
  if (pVVar5->pArray != (void **)0x0) {
    free(pVVar5->pArray);
    pVVar5->pArray = (void **)0x0;
  }
  free(pVVar5);
  if (vNodes->pArray != (void **)0x0) {
    free(vNodes->pArray);
    vNodes->pArray = (void **)0x0;
  }
  free(vNodes);
  if (vCover->pArray != (int *)0x0) {
    free(vCover->pArray);
    vCover->pArray = (int *)0x0;
  }
  free(vCover);
  if (vClauses->pArray != (int *)0x0) {
    free(vClauses->pArray);
    vClauses->pArray = (int *)0x0;
  }
  free(vClauses);
  pVVar7 = p->vCos;
  if (0 < pVVar7->nSize) {
    lVar11 = 0;
    do {
      uVar12 = *(ulong *)((long)pVVar7->pArray[lVar11] + 8);
      iVar10 = *(int *)((uVar12 & 0xfffffffffffffffe) + 0x24);
      if (((long)iVar10 < 0) || (vMap->nSize <= iVar10)) goto LAB_00559651;
      if (vMap->pArray[iVar10] < 1) goto LAB_0055968f;
      uVar3 = ((uint)uVar12 & 1) + vMap->pArray[iVar10] * 2;
      if (lVar11 < (long)p->nObjs[3] - (long)nOutputs) {
        Vec_IntPush(p_01,p_00->nSize);
      }
      else {
        iVar10 = *(int *)((long)pVVar7->pArray[lVar11] + 0x24);
        if (((long)iVar10 < 0) || (vMap->nSize <= iVar10)) goto LAB_00559651;
        iVar10 = vMap->pArray[iVar10];
        if (iVar10 < 1) goto LAB_0055968f;
        Vec_IntPush(p_01,p_00->nSize);
        Vec_IntPush(p_00,iVar10 * 2);
        Vec_IntPush(p_00,uVar3 ^ 1);
        Vec_IntPush(p_01,p_00->nSize);
        Vec_IntPush(p_00,iVar10 * 2 + 1);
      }
      Vec_IntPush(p_00,uVar3);
      lVar11 = lVar11 + 1;
      pVVar7 = p->vCos;
    } while (lVar11 < pVVar7->nSize);
  }
  iVar10 = p->pConst1->Id;
  if ((-1 < (long)iVar10) && (iVar10 < vMap->nSize)) {
    iVar10 = vMap->pArray[iVar10];
    if (0 < iVar10) {
      Vec_IntPush(p_01,p_00->nSize);
      Vec_IntPush(p_00,iVar10 * 2);
      pCVar8 = (Cnf_Dat_t *)calloc(1,0x48);
      pCVar8->pMan = p;
      pCVar8->nVars = iVar13 + 1;
      iVar13 = p_00->nSize;
      pCVar8->nLiterals = iVar13;
      lVar11 = (long)p_01->nSize;
      pCVar8->nClauses = p_01->nSize;
      ppiVar9 = (int **)malloc(lVar11 * 8 + 8);
      pCVar8->pClauses = ppiVar9;
      piVar4 = p_00->pArray;
      p_00->nCap = 0;
      p_00->nSize = 0;
      p_00->pArray = (int *)0x0;
      *ppiVar9 = piVar4;
      if (0 < lVar11) {
        piVar4 = p_01->pArray;
        lVar14 = 0;
        do {
          ppiVar9[lVar14] = *ppiVar9 + piVar4[lVar14];
          lVar14 = lVar14 + 1;
        } while (lVar11 != lVar14);
      }
      ppiVar9[lVar11] = *ppiVar9 + iVar13;
      piVar4 = vMap->pArray;
      vMap->nCap = 0;
      vMap->nSize = 0;
      vMap->pArray = (int *)0x0;
      pCVar8->pVarNums = piVar4;
      if (p_00->pArray != (int *)0x0) {
        free(p_00->pArray);
        p_00->pArray = (int *)0x0;
      }
      free(p_00);
      if (p_01->pArray != (int *)0x0) {
        free(p_01->pArray);
        p_01->pArray = (int *)0x0;
      }
      free(p_01);
      if (vMap->pArray != (int *)0x0) {
        free(vMap->pArray);
        vMap->pArray = (int *)0x0;
      }
      free(vMap);
      return pCVar8;
    }
LAB_0055968f:
    __assert_fail("iSatVar > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/cnf/cnfFast.c"
                  ,0xb7,"int Cnf_ObjGetLit(Vec_Int_t *, Aig_Obj_t *, int)");
  }
LAB_00559651:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

Cnf_Dat_t * Cnf_DeriveFastClauses( Aig_Man_t * p, int nOutputs )
{
    Cnf_Dat_t * pCnf;
    Vec_Int_t * vLits, * vClas, * vMap, * vTemp;
    Vec_Ptr_t * vLeaves, * vNodes;
    Vec_Int_t * vCover;
    Aig_Obj_t * pObj;
    int i, k, nVars, Entry, OutLit, DriLit;

    vLits = Vec_IntAlloc( 1 << 16 );
    vClas = Vec_IntAlloc( 1 << 12 );
    vMap  = Vec_IntStartFull( Aig_ManObjNumMax(p) );

    // assign variables for the outputs
    nVars = 1;
    if ( nOutputs )
    {
        if ( Aig_ManRegNum(p) == 0 )
        {
            assert( nOutputs == Aig_ManCoNum(p) );
            Aig_ManForEachCo( p, pObj, i )
                Vec_IntWriteEntry( vMap, Aig_ObjId(pObj), nVars++ );
        }
        else
        {
            assert( nOutputs == Aig_ManRegNum(p) );
            Aig_ManForEachLiSeq( p, pObj, i )
                Vec_IntWriteEntry( vMap, Aig_ObjId(pObj), nVars++ );
        }
    }
    // assign variables to the internal nodes
    Aig_ManForEachNodeReverse( p, pObj, i )
        if ( pObj->fMarkA )
            Vec_IntWriteEntry( vMap, Aig_ObjId(pObj), nVars++ );
    // assign variables to the PIs and constant node
    Aig_ManForEachCi( p, pObj, i )
        Vec_IntWriteEntry( vMap, Aig_ObjId(pObj), nVars++ );
    Vec_IntWriteEntry( vMap, Aig_ObjId(Aig_ManConst1(p)), nVars++ );

    // create clauses
    vLeaves = Vec_PtrAlloc( 100 );
    vNodes  = Vec_PtrAlloc( 100 );
    vCover  = Vec_IntAlloc( 1 << 16 );
    vTemp   = Vec_IntAlloc( 100 );
    Aig_ManForEachNodeReverse( p, pObj, i )
    {
        if ( !pObj->fMarkA )
            continue;
        Cnf_ComputeClauses( p, pObj, vLeaves, vNodes, vMap, vCover, vTemp );
        Vec_IntForEachEntry( vTemp, Entry, k )
        {
            if ( Entry == 0 )
                Vec_IntPush( vClas, Vec_IntSize(vLits) );
            else
                Vec_IntPush( vLits, Entry );
        }       
    }
    Vec_PtrFree( vLeaves );
    Vec_PtrFree( vNodes );
    Vec_IntFree( vCover );
    Vec_IntFree( vTemp );

    // create clauses for the outputs
    Aig_ManForEachCo( p, pObj, i )
    {
        DriLit = Cnf_ObjGetLit( vMap, Aig_ObjFanin0(pObj), Aig_ObjFaninC0(pObj) );
        if ( i < Aig_ManCoNum(p) - nOutputs )
        {
            Vec_IntPush( vClas, Vec_IntSize(vLits) );
            Vec_IntPush( vLits, DriLit );
        }
        else
        {
            OutLit = Cnf_ObjGetLit( vMap, pObj, 0 );
            // first clause
            Vec_IntPush( vClas, Vec_IntSize(vLits) );
            Vec_IntPush( vLits, OutLit );
            Vec_IntPush( vLits, DriLit ^ 1 );
            // second clause
            Vec_IntPush( vClas, Vec_IntSize(vLits) );
            Vec_IntPush( vLits, OutLit ^ 1 );
            Vec_IntPush( vLits, DriLit );
        }
    }
 
    // write the constant literal
    OutLit = Cnf_ObjGetLit( vMap, Aig_ManConst1(p), 0 );
    Vec_IntPush( vClas, Vec_IntSize(vLits) );
    Vec_IntPush( vLits, OutLit );

    // create structure
    pCnf = ABC_CALLOC( Cnf_Dat_t, 1 );
    pCnf->pMan = p;
    pCnf->nVars = nVars;
    pCnf->nLiterals = Vec_IntSize( vLits );
    pCnf->nClauses  = Vec_IntSize( vClas );
    pCnf->pClauses  = ABC_ALLOC( int *, pCnf->nClauses + 1 );
    pCnf->pClauses[0] = Vec_IntReleaseArray( vLits );
    Vec_IntForEachEntry( vClas, Entry, i )
        pCnf->pClauses[i] = pCnf->pClauses[0] + Entry;
    pCnf->pClauses[pCnf->nClauses] = pCnf->pClauses[0] + pCnf->nLiterals;
    pCnf->pVarNums  = Vec_IntReleaseArray( vMap );

    // cleanup
    Vec_IntFree( vLits );
    Vec_IntFree( vClas );
    Vec_IntFree( vMap );
    return pCnf;
}